

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void QScopedPointerDeleter<QOutlineMapper>::cleanup(EVP_PKEY_CTX *ctx)

{
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    if (*(void **)(ctx + 0x70) != (void *)0x0) {
      QtPrivate::sizedFree(*(void **)(ctx + 0x70),*(long *)(ctx + 0x60) << 2);
    }
    if (*(void **)(ctx + 0x58) != (void *)0x0) {
      QtPrivate::sizedFree(*(void **)(ctx + 0x58),*(ulong *)(ctx + 0x48));
    }
    if (*(void **)(ctx + 0x40) != (void *)0x0) {
      QtPrivate::sizedFree(*(void **)(ctx + 0x40),*(long *)(ctx + 0x30) << 3);
    }
    if (*(void **)(ctx + 0x28) != (void *)0x0) {
      QtPrivate::sizedFree(*(void **)(ctx + 0x28),*(long *)(ctx + 0x18) << 4);
    }
    if (*(void **)(ctx + 0x10) != (void *)0x0) {
      QtPrivate::sizedFree(*(void **)(ctx + 0x10),*(long *)ctx << 2);
    }
    operator_delete(ctx,0x158);
    return;
  }
  return;
}

Assistant:

static inline void cleanup(T *pointer) noexcept
    {
        // Enforce a complete type.
        // If you get a compile error here, read the section on forward declared
        // classes in the QScopedPointer documentation.
        typedef char IsIncompleteType[ sizeof(T) ? 1 : -1 ];
        (void) sizeof(IsIncompleteType);

        delete pointer;
    }